

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void prepare_enc_workers(AV1_COMP *cpi,AVxWorkerHook hook,int num_workers)

{
  ulong uVar1;
  ThreadData_conflict *__src;
  AV1_COMMON *cm;
  EncWorkerData *pEVar2;
  AVxWorker *pAVar3;
  EncWorkerData *pEVar4;
  FRAME_COUNTS *__dest;
  bool bVar5;
  int32_t *piVar6;
  uint8_t *puVar7;
  int16_t *piVar8;
  ulong uVar9;
  MvCosts *__dest_00;
  IntraBCMVCosts *__dest_01;
  uint8_t *puVar10;
  ulong uVar11;
  WinnerModeStats *pWVar12;
  tran_low_t *ptVar13;
  MB_RD_RECORD *pMVar14;
  inter_modes_info *piVar15;
  ThreadData_conflict *pTVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  
  if (0 < num_workers) {
    __src = &cpi->td;
    cm = &cpi->common;
    uVar9 = (ulong)(uint)num_workers;
    do {
      uVar1 = uVar9 - 1;
      pAVar3 = (cpi->mt_info).workers;
      pEVar4 = (cpi->mt_info).tile_thr_data;
      pEVar2 = pEVar4 + uVar1;
      pAVar3[uVar1].hook = hook;
      pAVar3[uVar1].data1 = pEVar2;
      pAVar3[uVar1].data2 = (void *)0x0;
      pEVar4[uVar1].thread_id = (int)uVar1;
      pEVar4[uVar1].start = (int)uVar1;
      pEVar4[uVar1].cpi = cpi;
      pTVar16 = __src;
      if (uVar1 != 0) {
        pTVar16 = pEVar2->original_td;
      }
      pEVar2->td = pTVar16;
      pTVar16->intrabc_used = 0;
      pTVar16->deltaq_used = 0;
      pTVar16->abs_sum_level = 0;
      (pTVar16->rd_counts).seg_tmp_pred_cost[0] = 0;
      (pTVar16->rd_counts).seg_tmp_pred_cost[1] = 0;
      if (pTVar16 == __src) {
LAB_00a29a66:
        if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
          if ((cpi->sf).rd_sf.use_mb_rd_hash != 0) {
            pMVar14 = (MB_RD_RECORD *)aom_malloc(0x6248);
            (pTVar16->mb).txfm_search_info.mb_rd_record = pMVar14;
            if (pMVar14 == (MB_RD_RECORD *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate mb->txfm_search_info.mb_rd_record");
            }
          }
          if (((cm->current_frame).frame_type & 0xfd) != 0) {
            piVar15 = (inter_modes_info *)aom_malloc(0x53008);
            (pTVar16->mb).inter_modes_info = piVar15;
            if (piVar15 == (inter_modes_info *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate mb->inter_modes_info");
            }
          }
        }
      }
      else {
        memcpy(pTVar16,__src,0x256b0);
        memcpy(&pEVar2->td->rd_counts,&(cpi->td).rd_counts,0x598);
        pTVar16 = pEVar2->td;
        piVar6 = (pTVar16->obmc_buffer).mask;
        puVar10 = (pTVar16->obmc_buffer).above_pred;
        puVar7 = (pTVar16->obmc_buffer).left_pred;
        (pTVar16->mb).obmc_buffer.wsrc = (pTVar16->obmc_buffer).wsrc;
        (pTVar16->mb).obmc_buffer.mask = piVar6;
        (pTVar16->mb).obmc_buffer.above_pred = puVar10;
        (pTVar16->mb).obmc_buffer.left_pred = puVar7;
        lVar18 = 0;
        bVar5 = true;
        do {
          bVar20 = bVar5;
          lVar17 = 0;
          bVar5 = true;
          do {
            bVar19 = bVar5;
            memcpy(pEVar2->td->hash_value_buffer[lVar18][lVar17],
                   (cpi->td).mb.intrabc_hash_info.hash_value_buffer[lVar18][lVar17],0x4000);
            (pEVar2->td->mb).intrabc_hash_info.hash_value_buffer[lVar18][lVar17] =
                 pEVar2->td->hash_value_buffer[lVar18][lVar17];
            lVar17 = 1;
            bVar5 = false;
          } while (bVar19);
          lVar18 = 1;
          bVar5 = false;
        } while (bVar20);
        if ((cpi->sf).inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
          __dest_00 = (MvCosts *)aom_malloc(0x80028);
          pTVar16 = pEVar2->td;
          pTVar16->mv_costs_alloc = __dest_00;
          if (__dest_00 == (MvCosts *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate thread_data->td->mv_costs_alloc");
            pTVar16 = pEVar2->td;
            __dest_00 = pTVar16->mv_costs_alloc;
          }
          (pTVar16->mb).mv_costs = __dest_00;
          memcpy(__dest_00,(cpi->td).mb.mv_costs,0x80028);
        }
        pTVar16 = pEVar2->td;
        if ((cpi->sf).intra_sf.dv_cost_upd_level == INTERNAL_COST_UPD_OFF) goto LAB_00a29a66;
        (pTVar16->mb).dv_costs = (IntraBCMVCosts *)0x0;
        if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
          if ((((((cm->current_frame).frame_type & 0xfd) == 0) &&
               ((cpi->common).features.allow_screen_content_tools == true)) &&
              ((cpi->common).features.allow_intrabc != false)) &&
             (((cpi->oxcf).pass != AOM_RC_FIRST_PASS && (cpi->compressor_stage != '\x01')))) {
            __dest_01 = (IntraBCMVCosts *)aom_malloc(0x40018);
            pTVar16 = pEVar2->td;
            pTVar16->dv_costs_alloc = __dest_01;
            if (__dest_01 == (IntraBCMVCosts *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate thread_data->td->dv_costs_alloc");
              pTVar16 = pEVar2->td;
              __dest_01 = pTVar16->dv_costs_alloc;
            }
            (pTVar16->mb).dv_costs = __dest_01;
            memcpy(__dest_01,(cpi->td).mb.dv_costs,0x40018);
            pTVar16 = pEVar2->td;
          }
          goto LAB_00a29a66;
        }
      }
      av1_alloc_src_diff_buf(cm,&pTVar16->mb);
      puVar10 = (uint8_t *)aom_memalign(0x10,0x8000);
      (pTVar16->mb).e_mbd.seg_mask = puVar10;
      if (puVar10 == (uint8_t *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate mb->e_mbd.seg_mask");
      }
      if (((((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) &&
          (((cpi->sf).rt_sf.use_nonrd_pick_mode == 0 || ((cpi->sf).rt_sf.hybrid_intra_pickmode != 0)
           ))) && (uVar11 = (ulong)(cpi->sf).winner_mode_sf.multi_winner_mode_type, uVar11 != 0)) {
        pWVar12 = (WinnerModeStats *)aom_malloc((long)winner_mode_count_allowed[uVar11] * 0x40f0);
        (pTVar16->mb).winner_mode_stats = pWVar12;
        if (pWVar12 == (WinnerModeStats *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate mb->winner_mode_stats");
        }
      }
      ptVar13 = (tran_low_t *)
                aom_memalign(0x20,(long)(1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                                               [((cpi->common).seq_params)->sb_size] & 0x1f)) << 2);
      (pTVar16->mb).dqcoeff_buf = ptVar13;
      if (ptVar13 == (tran_low_t *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate mb->dqcoeff_buf");
      }
      av1_init_rtc_counters(&pEVar2->td->mb);
      pTVar16 = pEVar2->td;
      (pTVar16->mb).palette_pixels = 0;
      __dest = pTVar16->counts;
      if (__dest != &cpi->counts) {
        memcpy(__dest,&cpi->counts,0xc0);
      }
      if (uVar9 == 1) {
        return;
      }
      pTVar16 = pEVar2->td;
      (pTVar16->mb).palette_buffer = pTVar16->palette_buffer;
      puVar10 = (pTVar16->comp_rd_buffer).pred1;
      (pTVar16->mb).comp_rd_buffer.pred0 = (pTVar16->comp_rd_buffer).pred0;
      (pTVar16->mb).comp_rd_buffer.pred1 = puVar10;
      piVar8 = (pTVar16->comp_rd_buffer).diff10;
      (pTVar16->mb).comp_rd_buffer.residual1 = (pTVar16->comp_rd_buffer).residual1;
      (pTVar16->mb).comp_rd_buffer.diff10 = piVar8;
      (pTVar16->mb).comp_rd_buffer.tmp_best_mask_buf = (pTVar16->comp_rd_buffer).tmp_best_mask_buf;
      pTVar16 = pEVar2->td;
      puVar10 = pTVar16->tmp_pred_bufs[0];
      (pTVar16->mb).tmp_conv_dst = pTVar16->tmp_conv_dst;
      (pTVar16->mb).tmp_pred_bufs[0] = puVar10;
      (pEVar2->td->mb).tmp_pred_bufs[1] = pEVar2->td->tmp_pred_bufs[1];
      pTVar16 = pEVar2->td;
      (pTVar16->mb).pixel_gradient_info = pTVar16->pixel_gradient_info;
      (pTVar16->mb).src_var_info_of_4x4_sub_blocks = pTVar16->src_var_info_of_4x4_sub_blocks;
      (pTVar16->mb).e_mbd.tmp_conv_dst = (pTVar16->mb).tmp_conv_dst;
      (pEVar2->td->mb).e_mbd.tmp_obmc_bufs[0] = (pEVar2->td->mb).tmp_pred_bufs[0];
      (pEVar2->td->mb).e_mbd.tmp_obmc_bufs[1] = (pEVar2->td->mb).tmp_pred_bufs[1];
      bVar5 = 1 < (long)uVar9;
      uVar9 = uVar1;
    } while (bVar5);
  }
  return;
}

Assistant:

static inline void prepare_enc_workers(AV1_COMP *cpi, AVxWorkerHook hook,
                                       int num_workers) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1_COMMON *const cm = &cpi->common;
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &mt_info->workers[i];
    EncWorkerData *const thread_data = &mt_info->tile_thr_data[i];

    worker->hook = hook;
    worker->data1 = thread_data;
    worker->data2 = NULL;

    thread_data->thread_id = i;
    // Set the starting tile for each thread.
    thread_data->start = i;

    thread_data->cpi = cpi;
    if (i == 0) {
      thread_data->td = &cpi->td;
    } else {
      thread_data->td = thread_data->original_td;
    }

    thread_data->td->intrabc_used = 0;
    thread_data->td->deltaq_used = 0;
    thread_data->td->abs_sum_level = 0;
    thread_data->td->rd_counts.seg_tmp_pred_cost[0] = 0;
    thread_data->td->rd_counts.seg_tmp_pred_cost[1] = 0;

    // Before encoding a frame, copy the thread data from cpi.
    if (thread_data->td != &cpi->td) {
      thread_data->td->mb = cpi->td.mb;
      thread_data->td->rd_counts = cpi->td.rd_counts;
      thread_data->td->mb.obmc_buffer = thread_data->td->obmc_buffer;

      for (int x = 0; x < 2; x++) {
        for (int y = 0; y < 2; y++) {
          memcpy(thread_data->td->hash_value_buffer[x][y],
                 cpi->td.mb.intrabc_hash_info.hash_value_buffer[x][y],
                 AOM_BUFFER_SIZE_FOR_BLOCK_HASH *
                     sizeof(*thread_data->td->hash_value_buffer[0][0]));
          thread_data->td->mb.intrabc_hash_info.hash_value_buffer[x][y] =
              thread_data->td->hash_value_buffer[x][y];
        }
      }
      // Keep these conditional expressions in sync with the corresponding ones
      // in accumulate_counters_enc_workers().
      if (cpi->sf.inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        CHECK_MEM_ERROR(
            cm, thread_data->td->mv_costs_alloc,
            (MvCosts *)aom_malloc(sizeof(*thread_data->td->mv_costs_alloc)));
        thread_data->td->mb.mv_costs = thread_data->td->mv_costs_alloc;
        memcpy(thread_data->td->mb.mv_costs, cpi->td.mb.mv_costs,
               sizeof(MvCosts));
      }
      if (cpi->sf.intra_sf.dv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        // Reset dv_costs to NULL for worker threads when dv cost update is
        // enabled so that only dv_cost_upd_level needs to be checked before the
        // aom_free() call for the same.
        thread_data->td->mb.dv_costs = NULL;
        if (av1_need_dv_costs(cpi)) {
          CHECK_MEM_ERROR(cm, thread_data->td->dv_costs_alloc,
                          (IntraBCMVCosts *)aom_malloc(
                              sizeof(*thread_data->td->dv_costs_alloc)));
          thread_data->td->mb.dv_costs = thread_data->td->dv_costs_alloc;
          memcpy(thread_data->td->mb.dv_costs, cpi->td.mb.dv_costs,
                 sizeof(IntraBCMVCosts));
        }
      }
    }
    av1_alloc_mb_data(cpi, &thread_data->td->mb);

    // Reset rtc counters.
    av1_init_rtc_counters(&thread_data->td->mb);

    thread_data->td->mb.palette_pixels = 0;

    if (thread_data->td->counts != &cpi->counts) {
      memcpy(thread_data->td->counts, &cpi->counts, sizeof(cpi->counts));
    }

    if (i > 0) {
      thread_data->td->mb.palette_buffer = thread_data->td->palette_buffer;
      thread_data->td->mb.comp_rd_buffer = thread_data->td->comp_rd_buffer;
      thread_data->td->mb.tmp_conv_dst = thread_data->td->tmp_conv_dst;
      for (int j = 0; j < 2; ++j) {
        thread_data->td->mb.tmp_pred_bufs[j] =
            thread_data->td->tmp_pred_bufs[j];
      }
      thread_data->td->mb.pixel_gradient_info =
          thread_data->td->pixel_gradient_info;

      thread_data->td->mb.src_var_info_of_4x4_sub_blocks =
          thread_data->td->src_var_info_of_4x4_sub_blocks;

      thread_data->td->mb.e_mbd.tmp_conv_dst = thread_data->td->mb.tmp_conv_dst;
      for (int j = 0; j < 2; ++j) {
        thread_data->td->mb.e_mbd.tmp_obmc_bufs[j] =
            thread_data->td->mb.tmp_pred_bufs[j];
      }
    }
  }
}